

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CoreMLModels::Gazetteer::clear_ClassLabels(Gazetteer *this)

{
  ClassLabelsCase CVar1;
  Gazetteer *this_local;
  
  CVar1 = ClassLabels_case(this);
  if (((CVar1 != CLASSLABELS_NOT_SET) && (CVar1 == kStringClassLabels)) &&
     ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
    (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Gazetteer::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.Gazetteer)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      delete ClassLabels_.stringclasslabels_;
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}